

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

int Sbd_ManCutIsTopo(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vCut,int iObj)

{
  int Id;
  int iVar1;
  
  Gia_ManIncrementTravId(p);
  for (iVar1 = 0; iVar1 < vCut->nSize; iVar1 = iVar1 + 1) {
    Id = Vec_IntEntry(vCut,iVar1);
    Gia_ObjSetTravIdCurrentId(p,Id);
  }
  iVar1 = Sbd_ManCutIsTopo_rec(p,vMirrors,iObj);
  if (iVar1 != 0) {
    return 1;
  }
  printf("Cut of node %d is not tological\n",(ulong)(uint)iObj);
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0x9c,"int Sbd_ManCutIsTopo(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

int Sbd_ManCutIsTopo( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vCut, int iObj )
{
    int i, Entry, RetValue;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vCut, Entry, i )
        Gia_ObjSetTravIdCurrentId( p, Entry );        
    RetValue = Sbd_ManCutIsTopo_rec( p, vMirrors, iObj );
    if ( RetValue == 0 )
        printf( "Cut of node %d is not tological\n", iObj );
    assert( RetValue );
    return RetValue;
}